

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O0

void __thiscall
mocker::anon_unknown_6::FindRedundantNodes::operator()(FindRedundantNodes *this,FuncCallExpr *node)

{
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  bool bVar1;
  element_type *peVar2;
  vector<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
  *this_01;
  shared_ptr<mocker::ast::ASTNode> local_58;
  reference local_48;
  shared_ptr<mocker::ast::Expression> *arg;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
  *__range2;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_20;
  FuncCallExpr *local_18;
  FuncCallExpr *node_local;
  FindRedundantNodes *this_local;
  
  this_00 = this->pureFunc;
  local_18 = node;
  node_local = (FuncCallExpr *)this;
  peVar2 = std::
           __shared_ptr_access<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&node->identifier);
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::find(this_00,&peVar2->val);
  __range2 = (vector<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
              *)std::
                unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end(this->pureFunc);
  bVar1 = std::__detail::operator!=
                    (&local_20,
                     (_Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      *)&__range2);
  if (bVar1) {
    this->hasSideEffect = true;
  }
  else {
    this_01 = &local_18->args;
    __end2 = std::
             vector<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
             ::begin(this_01);
    arg = (shared_ptr<mocker::ast::Expression> *)
          std::
          vector<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>
          ::end(this_01);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::shared_ptr<mocker::ast::Expression>_*,_std::vector<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>_>
                                       *)&arg), bVar1) {
      local_48 = __gnu_cxx::
                 __normal_iterator<const_std::shared_ptr<mocker::ast::Expression>_*,_std::vector<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>_>
                 ::operator*(&__end2);
      std::shared_ptr<mocker::ast::ASTNode>::shared_ptr<mocker::ast::Expression,void>
                (&local_58,local_48);
      visit(this,&local_58);
      std::shared_ptr<mocker::ast::ASTNode>::~shared_ptr(&local_58);
      __gnu_cxx::
      __normal_iterator<const_std::shared_ptr<mocker::ast::Expression>_*,_std::vector<std::shared_ptr<mocker::ast::Expression>,_std::allocator<std::shared_ptr<mocker::ast::Expression>_>_>_>
      ::operator++(&__end2);
    }
  }
  return;
}

Assistant:

void operator()(const ast::FuncCallExpr &node) const override {
    if (pureFunc.find(node.identifier->val) != pureFunc.end()) {
      hasSideEffect = true;
      return;
    }
    for (auto &arg : node.args)
      visit(arg);
  }